

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gia_GlaDumpAbsracted(Gla_Man_t *p,int fVerbose)

{
  char *pcVar1;
  Vec_Int_t *vGateClasses;
  Gia_Man_t *pInit;
  char *pFileName;
  
  pcVar1 = p->pPars->pFileVabs;
  pFileName = "glabs.aig";
  if (pcVar1 != (char *)0x0) {
    pFileName = pcVar1;
  }
  if (fVerbose != 0) {
    Abc_Print((int)p,"Dumping abstracted model into file \"%s\"...\n",pFileName);
  }
  vGateClasses = Gla_ManTranslate(p);
  pInit = Gia_ManDupAbsGates(p->pGia0,vGateClasses);
  if (vGateClasses != (Vec_Int_t *)0x0) {
    if (vGateClasses->pArray != (int *)0x0) {
      free(vGateClasses->pArray);
    }
    free(vGateClasses);
  }
  Gia_AigerWrite(pInit,pFileName,0,0);
  Gia_ManStop(pInit);
  return;
}

Assistant:

void Gia_GlaDumpAbsracted( Gla_Man_t * p, int fVerbose )
{
    char * pFileNameDef = "glabs.aig";
    char * pFileName = p->pPars->pFileVabs ? p->pPars->pFileVabs : pFileNameDef;
    Gia_Man_t * pAbs;
    Vec_Int_t * vGateClasses;
    if ( fVerbose )
        Abc_Print( 1, "Dumping abstracted model into file \"%s\"...\n", pFileName );
    // create abstraction
    vGateClasses = Gla_ManTranslate( p );
    pAbs = Gia_ManDupAbsGates( p->pGia0, vGateClasses );
    Vec_IntFreeP( &vGateClasses );
    // write into file
    Gia_AigerWrite( pAbs, pFileName, 0, 0 );
    Gia_ManStop( pAbs );
}